

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<long>::
linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
          (Earcut<long> *this,
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *points,bool clockwise)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference vector;
  size_type __n;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Node *local_88;
  double p21;
  double p11;
  double p10;
  double p20;
  value_type *p2;
  value_type *p1;
  Node *last;
  size_t j;
  size_t i;
  size_t len;
  double sum;
  bool clockwise_local;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *points_local;
  Earcut<long> *this_local;
  
  len = 0;
  sVar3 = std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::size(points);
  p1 = (value_type *)0x0;
  j = 0;
  if (sVar3 == 0) {
    local_88 = (Node *)0x0;
  }
  else {
    local_88 = (Node *)(sVar3 - 1);
  }
  last = local_88;
  for (; j < sVar3; j = j + 1) {
    pvVar4 = std::
             vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ::operator[](points,j);
    vector = std::
             vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ::operator[](points,(size_type)last);
    dVar5 = util::nth<0UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::get(vector);
    dVar6 = util::nth<0UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::get(pvVar4);
    dVar7 = util::nth<1UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::get(pvVar4);
    dVar8 = util::nth<1UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::get(vector);
    len = (size_t)((dVar5 - dVar6) * (dVar7 + dVar8) + (double)len);
    last = (Node *)j;
  }
  j = sVar3;
  if (clockwise == 0.0 < (double)len) {
    for (j = 0; j < sVar3; j = j + 1) {
      sVar1 = this->vertices;
      pvVar4 = std::
               vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ::operator[](points,j);
      p1 = (value_type *)
           insertNode<Eigen::Matrix<double,1,2,1,1,2>>(this,sVar1 + j,pvVar4,(Node *)p1);
    }
  }
  else {
    while (__n = j - 1, j != 0) {
      sVar1 = this->vertices;
      pvVar4 = std::
               vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ::operator[](points,__n);
      p1 = (value_type *)
           insertNode<Eigen::Matrix<double,1,2,1,1,2>>(this,sVar1 + __n,pvVar4,(Node *)p1);
      j = __n;
    }
  }
  if ((p1 != (value_type *)0x0) &&
     (bVar2 = equals(this,(Node *)p1,
                     (Node *)p1[2].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                             m_storage.m_data.array[0]), bVar2)) {
    removeNode(this,(Node *)p1);
    p1 = (value_type *)
         p1[2].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
         [0];
  }
  this->vertices = sVar3 + this->vertices;
  return (Node *)p1;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}